

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O2

void __thiscall HighsBasis::clear(HighsBasis *this)

{
  pointer pHVar1;
  
  invalidate(this);
  pHVar1 = (this->row_status).
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->row_status).super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
      _M_impl.super__Vector_impl_data._M_finish != pHVar1) {
    (this->row_status).super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
    _M_impl.super__Vector_impl_data._M_finish = pHVar1;
  }
  pHVar1 = (this->col_status).
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->col_status).super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
      _M_impl.super__Vector_impl_data._M_finish != pHVar1) {
    (this->col_status).super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
    _M_impl.super__Vector_impl_data._M_finish = pHVar1;
  }
  return;
}

Assistant:

void HighsBasis::clear() {
  this->invalidate();
  this->row_status.clear();
  this->col_status.clear();
}